

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRConstant * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::
allocate<spirv_cross::TypedID<(spirv_cross::Types)1>&>
          (ObjectPool<spirv_cross::SPIRConstant> *this,TypedID<(spirv_cross::Types)1> *p)

{
  uint uVar1;
  SPIRConstant *this_00;
  bool bVar2;
  uint32_t constant_type_;
  size_t sVar3;
  SPIRConstant **ppSVar4;
  SPIRConstant *ptr;
  uint local_34;
  SPIRConstant *pSStack_30;
  uint i;
  SPIRConstant *ptr_1;
  TypedID *pTStack_20;
  uint num_objects;
  TypedID<(spirv_cross::Types)1> *p_local;
  ObjectPool<spirv_cross::SPIRConstant> *this_local;
  
  pTStack_20 = (TypedID *)p;
  p_local = (TypedID<(spirv_cross::Types)1> *)this;
  bVar2 = VectorView<spirv_cross::SPIRConstant_*>::empty
                    (&(this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_30 = (SPIRConstant *)malloc((ulong)ptr_1._4_4_ * 0x168);
    if (pSStack_30 == (SPIRConstant *)0x0) {
      return (SPIRConstant *)0x0;
    }
    for (local_34 = 0; local_34 < ptr_1._4_4_; local_34 = local_34 + 1) {
      ptr = pSStack_30 + local_34;
      SmallVector<spirv_cross::SPIRConstant_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRConstant*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffd0);
  }
  ppSVar4 = VectorView<spirv_cross::SPIRConstant_*>::back
                      (&(this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>);
  this_00 = *ppSVar4;
  SmallVector<spirv_cross::SPIRConstant_*,_0UL>::pop_back(&this->vacants);
  constant_type_ = TypedID::operator_cast_to_unsigned_int(pTStack_20);
  SPIRConstant::SPIRConstant(this_00,constant_type_);
  return this_00;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}